

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flute_mst.c
# Opt level: O2

Tree flute_mr(int d,int *xs,int *ys,int *s,int acc,int rounds,int **dist,int *threshold_x,
             int *threshold_y,int *threshold,int *best_round,int *min_node1,int *min_node2,int **nb)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar7;
  undefined4 uVar8;
  Branch *__ptr;
  dl_el_s *pdVar6;
  int iVar9;
  int iVar10;
  dl_t paVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  Tree *__ptr_00;
  dl_el *pdVar15;
  uint uVar16;
  int *piVar17;
  ulong uVar18;
  int iVar19;
  ulong uVar20;
  dl_t *ppaVar21;
  long lVar22;
  ulong uVar23;
  long lVar24;
  long d_00;
  long lVar25;
  bool bVar26;
  Tree TVar27;
  Tree TVar28;
  Tree t2;
  int iStack_3ec14;
  Branch *pBStack_3ec08;
  ulong uStack_3ec00;
  uint uStack_3ebd8;
  int *order [110];
  int idx [500];
  int tree_id [500];
  int offset [500];
  int tree_size [500];
  int edges [1000];
  int subroot [500];
  int suproot [500];
  int y [1000];
  int x [1000];
  int isSuperRoot [500];
  int xmap [1000];
  int si [500];
  int new_s [1000];
  int order_base [55000];
  
  d_00 = (long)d;
  ppaVar21 = ht;
  for (lVar24 = 0; lVar24 <= d_00; lVar24 = lVar24 + 1) {
    paVar11 = dl_alloc();
    *ppaVar21 = paVar11;
    ppaVar21 = ppaVar21 + 1;
  }
  piVar17 = order_base;
  for (lVar24 = 0; lVar24 != 0x6e; lVar24 = lVar24 + 1) {
    order[lVar24] = piVar17;
    piVar17 = piVar17 + d_00;
  }
  pBStack_3ec08 = (Branch *)0x0;
  uVar20 = 0;
  if (0 < d) {
    uVar20 = (ulong)(uint)d;
  }
  lVar24 = (long)(d * 2 + -2);
  uStack_3ec00 = 0x7fffffff;
  do {
    if (rounds < 0) {
LAB_00124591:
      for (lVar24 = 0; lVar24 <= d_00; lVar24 = lVar24 + 1) {
        pdVar15 = ht[lVar24]->first;
        while (pdVar15 != (dl_el *)0x0) {
          pdVar6 = pdVar15->next;
          free(pdVar15[1].next);
          pdVar15 = pdVar6;
        }
        dl_clear(ht[lVar24]);
        free(ht[lVar24]);
        ht[lVar24] = (dl_t)0x0;
      }
      TVar28._0_8_ = (ulong)uStack_3ebd8 | uStack_3ec00 << 0x20;
      TVar28.branch = pBStack_3ec08;
      return TVar28;
    }
    for (uVar12 = 0; uVar20 != uVar12; uVar12 = uVar12 + 1) {
      x[uVar12] = xs[s[uVar12]];
      y[uVar12] = ys[uVar12];
      isSuperRoot[uVar12] = 0;
    }
    if (rounds == FIRST_ROUND) {
      build_rmst(d_00,x,y,edges,tree_id);
      for (uVar12 = 0; uVar20 != uVar12; uVar12 = uVar12 + 1) {
        dist[uVar12][uVar12] = 0;
      }
    }
    else {
      mst_from_heap(d,dist,*min_node1,*min_node2,nb,edges,tree_id);
    }
    iVar19 = rounds + -1;
    if (rounds != 0) {
      for (uVar12 = 0; uVar20 != uVar12; uVar12 = uVar12 + 1) {
        nb[uVar12][1] = 2;
      }
      iStack_3ec14 = 0;
    }
    lVar25 = 0;
    while (lVar22 = lVar25, uVar12 = 1, lVar22 < lVar24) {
      lVar25 = lVar22 + 2;
      if (rounds != 0) {
        iVar1 = tree_size[lVar22 + 0x1f5];
        iVar2 = tree_size[lVar22 + 500];
        enqueue(nb + iVar2,iVar1);
        enqueue(nb + iVar1,iVar2);
        iVar9 = x[iVar2] - x[iVar1];
        iVar3 = -iVar9;
        if (0 < iVar9) {
          iVar3 = iVar9;
        }
        iVar10 = y[iVar2] - y[iVar1];
        iVar9 = -iVar10;
        if (0 < iVar10) {
          iVar9 = iVar10;
        }
        iVar9 = iVar9 + iVar3;
        dist[iVar1][iVar2] = iVar9;
        dist[iVar2][iVar1] = iVar9;
        if (iStack_3ec14 <= iVar9) {
          iStack_3ec14 = iVar9;
        }
      }
    }
    for (uVar13 = 0; uVar20 != uVar13; uVar13 = uVar13 + 1) {
      tree_size[uVar13] = 1;
    }
    subroot[0] = edges[0];
    suproot[0] = edges[0];
    uVar16 = 1;
    lVar25 = (long)(d * 2 + -3);
    uVar13 = uVar12;
    while (uVar23 = (ulong)uVar16, uVar14 = uVar12, -1 < lVar25) {
      iVar1 = edges[lVar25];
      iVar2 = tree_size[lVar25 + 499];
      if ((double)acc * 1.3 + 8.0 <= (double)(tree_size[iVar1] + tree_size[iVar2])) {
        isSuperRoot[iVar2] = 1;
        suproot[uVar23] = iVar2;
        uVar16 = uVar16 + 1;
        subroot[uVar23] = iVar1;
        lVar25 = lVar25 + -2;
        uVar13 = uVar13 + 1;
      }
      else {
        tree_size[iVar2] = tree_size[iVar1] + tree_size[iVar2];
        lVar25 = lVar25 + -2;
      }
    }
    while (uVar14 < uVar23) {
      iVar1 = subroot[uVar14];
      tree_id[iVar1] = (int)(uVar14 + 1);
      tree_size[iVar1] = tree_size[iVar1] + 1;
      uVar14 = uVar14 + 1;
    }
    for (lVar25 = 0; lVar25 < lVar24; lVar25 = lVar25 + 2) {
      if (tree_id[edges[lVar25 + 1]] == 1) {
        tree_id[edges[lVar25 + 1]] = tree_id[edges[lVar25]];
      }
    }
    for (uVar14 = 0; uVar20 != uVar14; uVar14 = uVar14 + 1) {
      si[s[uVar14]] = (int)uVar14;
    }
    offset[1] = 0;
    for (uVar14 = uVar12; uVar14 < uVar23; uVar14 = uVar14 + 1) {
      offset[uVar14 + 1] = tree_size[edges[uVar14 + 999]] + offset[uVar14];
    }
    for (uVar14 = 0; uVar14 <= uVar23; uVar14 = uVar14 + 1) {
      idx[uVar14] = 0;
    }
    for (uVar14 = 0; uVar14 != uVar20; uVar14 = uVar14 + 1) {
      iVar1 = si[uVar14];
      iVar2 = tree_id[iVar1];
      iVar3 = idx[iVar2];
      idx[iVar2] = iVar3 + 1;
      iVar9 = xs[uVar14];
      x[(long)offset[iVar2] + (long)iVar3] = iVar9;
      xmap[uVar14] = iVar3;
      uVar18 = uVar12;
      if (isSuperRoot[iVar1] != 0) {
        for (; uVar18 < uVar23; uVar18 = uVar18 + 1) {
          if (suproot[uVar18] == iVar1) {
            iVar2 = idx[uVar18 + 1];
            idx[uVar18 + 1] = iVar2 + 1;
            x[(long)offset[uVar18 + 1] + (long)iVar2] = iVar9;
            xmap[(int)uVar18 + d] = iVar2;
          }
        }
      }
    }
    for (uVar14 = 0; uVar14 <= uVar23; uVar14 = uVar14 + 1) {
      idx[uVar14] = 0;
    }
    for (uVar14 = 0; uVar14 != uVar20; uVar14 = uVar14 + 1) {
      lVar25 = (long)tree_id[uVar14];
      iVar1 = idx[lVar25];
      idx[lVar25] = iVar1 + 1;
      lVar22 = (long)offset[lVar25] + (long)iVar1;
      y[lVar22] = ys[uVar14];
      new_s[lVar22] = xmap[s[uVar14]];
      order[lVar25 + -1][iVar1] = (int)uVar14;
      uVar18 = uVar12;
      if (isSuperRoot[uVar14] != 0) {
        for (; uVar18 < uVar23; uVar18 = uVar18 + 1) {
          if (uVar14 == (uint)suproot[uVar18]) {
            iVar1 = idx[uVar18 + 1];
            idx[uVar18 + 1] = iVar1 + 1;
            lVar25 = (long)offset[uVar18 + 1] + (long)iVar1;
            y[lVar25] = ys[uVar14];
            new_s[lVar25] = xmap[(int)uVar18 + d];
            order[uVar18][iVar1] = (int)uVar14;
          }
        }
      }
    }
    __ptr_00 = (Tree *)malloc(uVar23 << 4);
    lVar25 = 0;
    while( true ) {
      uVar12 = 1;
      bVar26 = uVar13 == 0;
      uVar13 = uVar13 - 1;
      if (bVar26) break;
      if (tree_size[*(int *)((long)subroot + lVar25)] < 2) {
        (&__ptr_00->deg)[lVar25] = 0;
      }
      else {
        iVar1 = *(int *)((long)offset + lVar25 + 4);
        TVar27 = flutes_c(tree_size[*(int *)((long)subroot + lVar25)],x + iVar1,y + iVar1,
                          new_s + iVar1,acc);
        *(long *)(&__ptr_00->deg + lVar25) = TVar27._0_8_;
        *(Branch **)((long)&__ptr_00->branch + lVar25 * 4) = TVar27.branch;
      }
      lVar25 = lVar25 + 4;
    }
    for (; uVar12 < uVar23; uVar12 = uVar12 + 1) {
      iVar1 = suproot[uVar12];
      lVar22 = (long)tree_id[iVar1];
      lVar25 = (long)tree_id[subroot[uVar12]];
      uVar4 = __ptr_00[lVar22 + -1].deg;
      uVar7 = __ptr_00[lVar22 + -1].length;
      TVar27.length = uVar7;
      TVar27.deg = uVar4;
      uVar5 = __ptr_00[lVar25 + -1].deg;
      uVar8 = __ptr_00[lVar25 + -1].length;
      t2.length = uVar8;
      t2.deg = uVar5;
      TVar27.branch = __ptr_00[lVar22 + -1].branch;
      t2.branch = __ptr_00[lVar25 + -1].branch;
      TVar27 = wmergetree(TVar27,t2,order[lVar22 + -1],order[lVar25 + -1],xs[s[iVar1]],ys[iVar1],acc
                         );
      __ptr_00[lVar25 + -1].deg = 0;
      __ptr_00[lVar22 + -1].deg = (int)TVar27._0_8_;
      __ptr_00[lVar22 + -1].length = (int)(TVar27._0_8_ >> 0x20);
      __ptr_00[lVar22 + -1].branch = TVar27.branch;
    }
    uVar12._0_4_ = __ptr_00->deg;
    uVar12._4_4_ = __ptr_00->length;
    __ptr = __ptr_00->branch;
    TVar27 = *__ptr_00;
    free(__ptr_00);
    if ((int)uStack_3ec00 < (int)uVar12._4_4_) {
      if (EARLY_QUIT_CRITERIA <= *best_round - rounds) {
        free(__ptr);
        goto LAB_00124591;
      }
    }
    else {
      if ((int)uStack_3ec00 != uVar12._4_4_) {
        free(pBStack_3ec08);
        uStack_3ec00 = uVar12 >> 0x20;
        pBStack_3ec08 = __ptr;
        uStack_3ebd8 = (undefined4)uVar12;
      }
      *best_round = rounds;
    }
    if (rounds != 0) {
      for (uVar12 = 0; uVar20 != uVar12; uVar12 = uVar12 + 1) {
        x[uVar12] = xs[s[uVar12]];
        y[uVar12] = ys[uVar12];
      }
      *min_node1 = edges[0];
      *min_node2 = edges[1];
      update_dist2(TVar27,dist,iStack_3ec14,edges,min_node1,min_node2,nb);
    }
    rounds = iVar19;
    if (pBStack_3ec08 != __ptr && __ptr != (Branch *)0x0) {
      free(__ptr);
    }
  } while( true );
}

Assistant:

Tree flute_mr(int d, DTYPE *xs, DTYPE *ys, int *s,
	      int acc, int rounds, DTYPE **dist,
	      DTYPE *threshold_x, DTYPE *threshold_y,
	      DTYPE *threshold, 
	      int *best_round,
	      int *min_node1, int *min_node2,
	      int **nb)
{
  int i, j, k, m, n, itr, node1, node2;
  DTYPE min_dist, longest;
  DTYPE dist1, dist2;
  Tree t, best_t, *subtree, ttmp;
  DTYPE min_x, max_x;

#if MR_FOR_SMALL_CASES_ONLY
  int num_subtree, subroot[MAXPART], suproot[MAXPART], isSuperRoot[D2M];
  int tree_id[D2M], tid, tree_size[D2M], edges[2*D2M];
  int idx[MAXPART], offset[MAXPART], *order[MAXT], order_base[MAXT*D2M];
  DTYPE x[D2M+MAXPART], y[D2M+MAXPART];
  int new_s[D2M+MAXPART], si[D2M], xmap[D2M+MAXPART];
#else
  int num_subtree, *subroot, *suproot, *isSuperRoot;
  int *tree_id, tid, *tree_size, *edges;
  int *idx, *offset, **order, *order_base;
  DTYPE *x, *y;
  int *new_s, *si, *xmap;

  subroot = (int*)malloc(sizeof(int)*MAXPART);
  suproot = (int*)malloc(sizeof(int)*MAXPART);
  idx = (int*)malloc(sizeof(int)*MAXPART);
  offset = (int*)malloc(sizeof(int)*MAXPART);
  order = (int**)malloc(sizeof(int*)*MAXT);

  isSuperRoot = (int*)malloc(sizeof(int)*d);
  tree_id = (int*)malloc(sizeof(int)*d);
  tree_size = (int*)malloc(sizeof(int)*d);
  edges = (int*)malloc(sizeof(int)*d*2);
  order_base = (int*)malloc(sizeof(int)*d*MAXT);
  new_s = (int*)malloc(sizeof(int)*(d+MAXPART));
  si = (int*)malloc(sizeof(int)*d);
  xmap = (int*)malloc(sizeof(int)*(d+MAXPART));
  x = (DTYPE*)malloc(sizeof(DTYPE)*(d+MAXPART));
  y = (DTYPE*)malloc(sizeof(DTYPE)*(d+MAXPART));
#endif

#if USE_HASHING
  if (new_ht) {
    for (i=0; i<=d; i++) {
      ht[i] = dl_alloc();
    }
  }
#endif

  best_t.branch = NULL;
  best_t.length = INFNTY;

  for (i=0; i<MAXT; i++) {
    //order[i] = &(order_base[i*D2(acc)]);
    order[i] = &(order_base[i*d]);
  }

  while (rounds>=0) {
    for (i=0; i<d; i++) {
      x[i] = xs[s[i]];
      y[i] = ys[i];
      isSuperRoot[i] = 0;
    }

    if (rounds==FIRST_ROUND) {
      build_rmst((long)d, x, y, edges, tree_id);
      for (i=0; i<d; i++) dist[i][i]=0;
    } else {
      mst_from_heap(d, dist, *min_node1, *min_node2, nb, edges, tree_id);
    }

    if (rounds!=0) {
      longest = 0;
      for (i=0; i<d; i++) {
	init_queue(nb[i]);
      }
    }

    for (i=0; i<2*d-2; ) {
      node1 = edges[i++];
      node2 = edges[i++];
      if (rounds!=0) {
	enqueue(&nb[node1], node2);
	enqueue(&nb[node2], node1);
	dist[node1][node2] = dist[node2][node1] =
	  ADIFF(x[node1], x[node2]) + ADIFF(y[node1], y[node2]);
	if (longest < dist[node1][node2]) {
	  longest = dist[node1][node2];
	}
      }
    }

    for (i=0; i<d; i++) {
      tree_size[i] = 1;  // the node itself
    }

    suproot[0] = subroot[0] = edges[0];
    num_subtree=1;

    for (i=2*d-3; i>=0; ) {
      node2 = edges[i--];
      node1 = edges[i--];
      j = tree_size[node1]+tree_size[node2];
      //Chris
      if (j >= TAU(acc)) {
	isSuperRoot[node1] = 1;
	suproot[num_subtree] = node1;
	subroot[num_subtree++] = node2;
      } else {
	tree_size[node1] = j;
      }
    }

    //assert(num_subtree<=MAXT);

    for (i=1; i<num_subtree; i++) {
      tree_id[subroot[i]] = i+1;
      tree_size[subroot[i]] += 1;  // to account for the link to parent tree
    }

    for (i=0; i<2*d-2; ) {
      node1 = edges[i++];
      node2 = edges[i++];
      if (tree_id[node2]==1) { // non-root node
	tree_id[node2] = tree_id[node1];
      }
    }

    // Find inverse si[] of s[]
    for (i=0; i<d; i++)
      si[s[i]] = i;

    offset[1] = 0;
    for (i=1; i<num_subtree; i++) {
      offset[i+1] = offset[i] + tree_size[subroot[i-1]];
    }
    //assert(offset[num_subtree]==d+num_subtree-1-tree_size[subroot[num_subtree-1]]);

    for (i=0; i<=num_subtree; i++)
      idx[i] = 0;

    for (i=0; i<d; i++) {
      tid = tree_id[si[i]];
      j = idx[tid]++;
      x[offset[tid]+j] = xs[i];
      xmap[i] = j;

      if (isSuperRoot[si[i]]) {
	for (k=1; k<num_subtree; k++) {
	  if (suproot[k]==si[i]) {
	    tid = k+1;
	    j = idx[tid]++;
	    x[offset[tid]+j] = xs[i];
	    xmap[d-1+tid] = j;
	  }
	}
      }
    }

    for (i=0; i<=num_subtree; i++)
      idx[i] = 0;

    for (i=0; i<d; i++) {
      tid = tree_id[i];
      j = idx[tid]++;
      y[offset[tid]+j] = ys[i];
      new_s[offset[tid]+j] = xmap[s[i]];
      order[tid-1][j] = i;

      if (isSuperRoot[i]) {
	for (k=1; k<num_subtree; k++) {
	  if (suproot[k]==i) {
	    tid = k+1;
	    j = idx[tid]++;
	    y[offset[tid]+j] = ys[i];
	    new_s[offset[tid]+j] = xmap[d-1+tid];
	    order[tid-1][j] = i;
	  }
	}
      }
    }

    subtree = (Tree*)malloc(num_subtree*sizeof(Tree));
    for (i=1; i<=num_subtree; i++) {
      if (tree_size[subroot[i-1]] <= 1) {
	subtree[i-1].deg = 0;
	continue;
      }

      t = flutes_c(tree_size[subroot[i-1]], x+offset[i], y+offset[i],
		   new_s+offset[i], acc);
    
      subtree[i-1] = t;
    }


    for (i=1; i<num_subtree; i++) {
      //assert(tree_id[suproot[i]] != tree_id[subroot[i]]);

      t = wmergetree(subtree[tree_id[suproot[i]]-1],
		     subtree[tree_id[subroot[i]]-1],
		     order[tree_id[suproot[i]]-1],
		     order[tree_id[subroot[i]]-1],
		     xs[s[suproot[i]]], ys[suproot[i]], acc);

      subtree[tree_id[subroot[i]]-1].deg = 0;
      subtree[tree_id[suproot[i]]-1] = t;
    }

    t = subtree[0];
    free(subtree);
  
    if (best_t.length < t.length) {
      if (*best_round-rounds >= EARLY_QUIT_CRITERIA) {
	if (t.branch) {
	  free(t.branch);
	}
	break;
      }
    } else if (best_t.length == t.length) {
      *best_round = rounds;
    } else if (best_t.length > t.length) {
      if (best_t.branch) {
	free(best_t.branch);
      }
      best_t = t;
      *best_round = rounds;
    }

    if (rounds > 0) {
      for (i=0; i<d; i++) {
	x[i] = xs[s[i]];
	y[i] = ys[i];
      }

      *min_node1 = edges[0];
      *min_node2 = edges[1];

      update_dist2(t, dist, longest, edges, min_node1, min_node2, nb);
    }

    if (t.branch != 0 && best_t.branch != t.branch) {
      free(t.branch);
    }

    rounds--;
  }
  
#if !(MR_FOR_SMALL_CASES_ONLY)
  free(subroot); free(suproot); free(idx); free(offset); free(order);
  free(isSuperRoot); free(tree_id); free(tree_size); free(edges);
  free(order_base); free(new_s); free(si); free(xmap); free(x); free(y);
#endif
  
#if USE_HASHING
  if (new_ht) {
    for (i=0; i<=d; i++) {
      dl_forall(Tree, ht[i], ttmp) {
	free(ttmp.branch);
      } dl_endfor;
      dl_free(ht[i]);
    }
  }
#endif
  
  return best_t;
}